

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O2

vm_meta_entry_t * __thiscall CVmMetaTable::get_entry_by_id(CVmMetaTable *this,char *id)

{
  int iVar1;
  char *__s1;
  char *__s2;
  ulong uVar2;
  vm_meta_entry_t *pvVar3;
  size_t entry_name_len;
  size_t name_len;
  
  __s1 = lib_find_vsn_suffix(id,'/',"000000",&name_len);
  pvVar3 = this->table_;
  uVar2 = 0;
  while( true ) {
    if (this->count_ <= uVar2) {
      return (vm_meta_entry_t *)0x0;
    }
    __s2 = lib_find_vsn_suffix(pvVar3->image_meta_name_,'/',"000000",&entry_name_len);
    if ((name_len == entry_name_len) &&
       (iVar1 = bcmp(id,pvVar3->image_meta_name_,name_len), iVar1 == 0)) break;
    pvVar3 = pvVar3 + 1;
    uVar2 = uVar2 + 1;
  }
  iVar1 = strcmp(__s1,__s2);
  if (0 < iVar1) {
    return (vm_meta_entry_t *)0x0;
  }
  return pvVar3;
}

Assistant:

vm_meta_entry_t *CVmMetaTable::get_entry_by_id(const char *id) const
{
    /* find the version suffix in the metaclass name, if any */
    size_t name_len;
    const char *vsn = lib_find_vsn_suffix(id, '/', "000000", &name_len);

    /* look up the metaclass by name */
    size_t i;
    vm_meta_entry_t *entry;
    for (i = 0, entry = table_ ; i < count_ ; ++entry, ++i)
    {
        /* find the version number in this entry */
        size_t entry_name_len;
        const char *entry_vsn = lib_find_vsn_suffix(
            entry->image_meta_name_, '/', "000000", &entry_name_len);

        /* see if this is a match */
        if (name_len == entry_name_len
            && memcmp(id, entry->image_meta_name_, name_len) == 0)
        {
            /* 
             *   we found a match to the name; make sure the version is at
             *   least as high as requested 
             */
            if (strcmp(vsn, entry_vsn) <= 0)
            {
                /* the loaded version is at least as new, so return it */
                return entry;
            }
            else
            {
                /* it's too old, so it's effectively not available */
                return 0;
            }
        }
    }

    /* didn't find a match */
    return 0;
}